

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::DescriptorProto_ExtensionRange::SerializeWithCachedSizesToArray
          (DescriptorProto_ExtensionRange *this,uint8 *target)

{
  uint uVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint8 *puVar3;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    uVar1 = this->start_;
    *target = '\b';
    if ((long)(int)uVar1 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar1,target + 1);
    }
    else if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    uVar1 = this->end_;
    *target = '\x10';
    if ((long)(int)uVar1 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar1,target + 1);
    }
    else if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar3 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar3;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* DescriptorProto_ExtensionRange::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional int32 start = 1;
  if (has_start()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->start(), target);
  }

  // optional int32 end = 2;
  if (has_end()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->end(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}